

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O2

unsigned_long id3_sync_safe(unsigned_long num)

{
  unsigned_long uVar1;
  long lVar2;
  
  uVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
    uVar1 = uVar1 | (ulong)((uint)num & 0x7f) << ((byte)lVar2 & 0x3f);
    num = num >> 7;
  }
  return uVar1;
}

Assistant:

static unsigned long id3_sync_safe(unsigned long num) {
  unsigned long res = 0;
  int i;
  for (i = 0; i < 4; i++) {
    res |= (num & 0x7F) << (i * 8);
    num >>= 7;
  }
  return res;
}